

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8_fp16.h
# Opt level: O3

void ncnn::conv2x2s1_weight_fp16_pack8_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int num_input,int num_output)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  unsigned_short uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  void *pvVar10;
  long lVar11;
  int k;
  long lVar12;
  long lVar13;
  ulong uVar14;
  unsigned_short *puVar15;
  ulong local_c0;
  Mat local_78;
  
  Mat::reshape(&local_78,kernel,4,num_input,num_output,(Allocator *)0x0);
  iVar9 = num_input + 7;
  if (-1 < num_input) {
    iVar9 = num_input;
  }
  iVar7 = num_output + 7;
  if (-1 < num_output) {
    iVar7 = num_output;
  }
  Mat::create(kernel_tm_pack8,4,iVar9 >> 3,iVar7 >> 3,0x80,0x40,(Allocator *)0x0);
  if (7 < num_output) {
    local_c0 = 0;
    do {
      if (7 < num_input) {
        sVar1 = kernel_tm_pack8->cstep;
        sVar2 = kernel_tm_pack8->elemsize;
        pvVar3 = kernel_tm_pack8->data;
        lVar13 = local_78.elemsize * local_78.cstep;
        iVar9 = kernel_tm_pack8->w;
        pvVar10 = (void *)(lVar13 * local_c0 + (long)local_78.data);
        lVar11 = (local_78.cstep * -7 + (long)local_78.w) * local_78.elemsize;
        lVar6 = local_78.elemsize * (long)local_78.w;
        uVar14 = 0;
        do {
          puVar15 = (unsigned_short *)
                    ((long)pvVar3 +
                    (uVar14 >> 3) * (long)iVar9 * sVar2 + (local_c0 >> 3) * sVar1 * sVar2);
          lVar12 = 0;
          do {
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar12 * 4));
            *puVar15 = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar12 * 4));
            lVar4 = lVar13 + lVar12 * 4;
            puVar15[1] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[2] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[3] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[4] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[5] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[6] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[7] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar11 + lVar4));
            lVar4 = lVar11 + lVar4;
            puVar15[8] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[9] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[10] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0xb] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0xc] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0xd] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0xe] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0xf] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar11 + lVar4));
            lVar4 = lVar11 + lVar4;
            puVar15[0x10] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x11] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x12] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x13] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x14] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x15] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x16] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x17] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar11 + lVar4));
            lVar4 = lVar11 + lVar4;
            puVar15[0x18] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x19] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x1a] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x1b] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x1c] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x1d] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x1e] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x1f] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar11 + lVar4));
            lVar4 = lVar11 + lVar4;
            puVar15[0x20] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x21] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x22] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x23] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x24] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x25] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x26] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x27] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar11 + lVar4));
            lVar4 = lVar11 + lVar4;
            puVar15[0x28] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x29] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x2a] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x2b] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x2c] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x2d] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x2e] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x2f] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar11 + lVar4));
            lVar4 = lVar11 + lVar4;
            puVar15[0x30] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x31] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x32] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x33] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x34] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x35] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x36] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x37] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar11 + lVar4));
            lVar4 = lVar11 + lVar4;
            puVar15[0x38] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x39] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x3a] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x3b] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x3c] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            lVar4 = lVar13 + lVar4;
            puVar15[0x3d] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 + lVar4));
            puVar15[0x3e] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar10 + lVar13 * 2 + lVar4));
            puVar15[0x3f] = uVar5;
            puVar15 = puVar15 + 0x40;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          uVar8 = uVar14 + 0xf;
          pvVar10 = (void *)((long)pvVar10 + lVar6 * 8);
          uVar14 = uVar14 + 8;
        } while (uVar8 < (uint)num_input);
      }
      local_c0 = local_c0 + 8;
    } while ((int)((uint)local_c0 | 7) < num_output);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv2x2s1_weight_fp16_pack8_avx(const Mat& kernel, Mat& kernel_tm_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(4, num_input, num_output);

    kernel_tm_pack8.create(4, num_input / 8, num_output / 8, (size_t)2 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = kernel_tm_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            unsigned short* g00 = (unsigned short*)g0.row(p / 8);

            for (int k = 0; k < 4; k++)
            {
                g00[0] = float32_to_float16(k00[k]);
                g00[1] = float32_to_float16(k10[k]);
                g00[2] = float32_to_float16(k20[k]);
                g00[3] = float32_to_float16(k30[k]);
                g00[4] = float32_to_float16(k40[k]);
                g00[5] = float32_to_float16(k50[k]);
                g00[6] = float32_to_float16(k60[k]);
                g00[7] = float32_to_float16(k70[k]);
                g00 += 8;
                g00[0] = float32_to_float16(k01[k]);
                g00[1] = float32_to_float16(k11[k]);
                g00[2] = float32_to_float16(k21[k]);
                g00[3] = float32_to_float16(k31[k]);
                g00[4] = float32_to_float16(k41[k]);
                g00[5] = float32_to_float16(k51[k]);
                g00[6] = float32_to_float16(k61[k]);
                g00[7] = float32_to_float16(k71[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k02[k]);
                g00[1] = float32_to_float16(k12[k]);
                g00[2] = float32_to_float16(k22[k]);
                g00[3] = float32_to_float16(k32[k]);
                g00[4] = float32_to_float16(k42[k]);
                g00[5] = float32_to_float16(k52[k]);
                g00[6] = float32_to_float16(k62[k]);
                g00[7] = float32_to_float16(k72[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k03[k]);
                g00[1] = float32_to_float16(k13[k]);
                g00[2] = float32_to_float16(k23[k]);
                g00[3] = float32_to_float16(k33[k]);
                g00[4] = float32_to_float16(k43[k]);
                g00[5] = float32_to_float16(k53[k]);
                g00[6] = float32_to_float16(k63[k]);
                g00[7] = float32_to_float16(k73[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k04[k]);
                g00[1] = float32_to_float16(k14[k]);
                g00[2] = float32_to_float16(k24[k]);
                g00[3] = float32_to_float16(k34[k]);
                g00[4] = float32_to_float16(k44[k]);
                g00[5] = float32_to_float16(k54[k]);
                g00[6] = float32_to_float16(k64[k]);
                g00[7] = float32_to_float16(k74[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k05[k]);
                g00[1] = float32_to_float16(k15[k]);
                g00[2] = float32_to_float16(k25[k]);
                g00[3] = float32_to_float16(k35[k]);
                g00[4] = float32_to_float16(k45[k]);
                g00[5] = float32_to_float16(k55[k]);
                g00[6] = float32_to_float16(k65[k]);
                g00[7] = float32_to_float16(k75[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k06[k]);
                g00[1] = float32_to_float16(k16[k]);
                g00[2] = float32_to_float16(k26[k]);
                g00[3] = float32_to_float16(k36[k]);
                g00[4] = float32_to_float16(k46[k]);
                g00[5] = float32_to_float16(k56[k]);
                g00[6] = float32_to_float16(k66[k]);
                g00[7] = float32_to_float16(k76[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k07[k]);
                g00[1] = float32_to_float16(k17[k]);
                g00[2] = float32_to_float16(k27[k]);
                g00[3] = float32_to_float16(k37[k]);
                g00[4] = float32_to_float16(k47[k]);
                g00[5] = float32_to_float16(k57[k]);
                g00[6] = float32_to_float16(k67[k]);
                g00[7] = float32_to_float16(k77[k]);

                g00 += 8;
            }
        }
    }
}